

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Trainer::Node::Node(Node *this,int actionNum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  double *pdVar6;
  int local_18;
  int a;
  int actionNum_local;
  Node *this_local;
  
  this->mActionNum = (uint8_t)actionNum;
  this->mAlreadyCalculated = false;
  this->mNeedToUpdateStrategy = false;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)actionNum;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar5);
  this->mRegretSum = pdVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)actionNum;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar5);
  this->mStrategy = pdVar6;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)actionNum;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar5);
  this->mStrategySum = pdVar6;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)actionNum;
  uVar5 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar6 = (double *)operator_new__(uVar5);
  this->mAverageStrategy = pdVar6;
  for (local_18 = 0; local_18 < actionNum; local_18 = local_18 + 1) {
    this->mRegretSum[local_18] = 0.0;
    this->mStrategy[local_18] = 1.0 / (double)actionNum;
    this->mStrategySum[local_18] = 0.0;
    this->mAverageStrategy[local_18] = 0.0;
  }
  return;
}

Assistant:

Node::Node(const int actionNum) : mActionNum(actionNum), mAlreadyCalculated(false), mNeedToUpdateStrategy(false) {
    mRegretSum = new double[actionNum];
    mStrategy = new double[actionNum];
    mStrategySum = new double[actionNum];
    mAverageStrategy = new double[actionNum];
    for (int a = 0; a < actionNum; ++a) {
        mRegretSum[a] = 0.0;
        mStrategy[a] = 1.0 / (double) actionNum;
        mStrategySum[a] = 0.0;
        mAverageStrategy[a] = 0.0;
    }
}